

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
DiceRoller::roll(vector<int,_std::allocator<int>_> *__return_storage_ptr__,DiceRoller *this,
                int numDice)

{
  vector<int,_std::allocator<int>_> *this_00;
  iterator __first;
  iterator __last;
  int local_30;
  int local_2c;
  int result;
  int i;
  vector<int,_std::allocator<int>_> *results;
  DiceRoller *pDStack_18;
  int numDice_local;
  DiceRoller *this_local;
  
  results._4_4_ = numDice;
  pDStack_18 = this;
  this_local = (DiceRoller *)__return_storage_ptr__;
  this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(this_00);
  _result = this_00;
  for (local_2c = 0; local_2c < results._4_4_; local_2c = local_2c + 1) {
    local_30 = Dice::roll();
    std::vector<int,_std::allocator<int>_>::push_back(_result,&local_30);
    saveRoll(this,local_30);
  }
  __first = std::vector<int,_std::allocator<int>_>::begin(_result);
  __last = std::vector<int,_std::allocator<int>_>::end(_result);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,_result);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> DiceRoller::roll(int numDice) {
    auto* results = new std::vector<int>();
    for (int i = 0; i < numDice; i++) {
        int result = Dice::roll();
        results->push_back(result);
        saveRoll(result);
    }

    std::sort(results->begin(), results->end());
    return *results;
}